

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  Geometry *this;
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  long lVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  byte bVar25;
  ulong *puVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  size_t i;
  long lVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2458 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    return false;
  }
  local_2370[0] = 0;
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
  auVar54 = ZEXT3264(auVar33);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_2458 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar3 = (context->query_radius).field_0;
    local_2458 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  }
  puVar26 = local_2368;
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
  auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
  auVar56 = ZEXT3264(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
  auVar58 = ZEXT3264(auVar37);
  auVar32 = vmulss_avx512f(auVar33._0_16_,auVar33._0_16_);
  auVar33._0_4_ = auVar32._0_4_;
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_4_ = auVar33._0_4_;
  auVar33._12_4_ = auVar33._0_4_;
  auVar33._16_4_ = auVar33._0_4_;
  auVar33._20_4_ = auVar33._0_4_;
  auVar33._24_4_ = auVar33._0_4_;
  auVar33._28_4_ = auVar33._0_4_;
  bVar20 = false;
  auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar59 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar60 = ZEXT3264(auVar37);
LAB_01f22bfe:
  auVar53 = auVar54._0_32_;
  auVar37 = vsubps_avx512vl(auVar34,auVar53);
  auVar38 = vaddps_avx512vl(auVar34,auVar53);
  auVar55 = auVar56._0_32_;
  auVar39 = vsubps_avx512vl(auVar35,auVar55);
  auVar40 = vaddps_avx512vl(auVar35,auVar55);
  auVar57 = auVar58._0_32_;
  auVar41 = vsubps_avx512vl(auVar36,auVar57);
  auVar42 = vaddps_avx512vl(auVar36,auVar57);
LAB_01f22c22:
  pfVar1 = (float *)(puVar26 + -1);
  puVar26 = puVar26 + -2;
  if (*pfVar1 <= (float)local_2458._0_4_) {
    uVar28 = *puVar26;
    do {
      do {
        uVar27 = (uint)uVar28;
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar28 & 8) != 0) {
LAB_01f2317e:
            if ((ulong)(uVar27 & 0xf) == 8) goto LAB_01f2330f;
            lVar29 = (uVar28 & 0xfffffffffffffff0) + 0x40;
            lVar21 = 0;
            bVar23 = 0;
            goto LAB_01f231c6;
          }
          uVar22 = uVar28 & 0xfffffffffffffff0;
          fVar2 = query->time;
          auVar49._4_4_ = fVar2;
          auVar49._0_4_ = fVar2;
          auVar49._8_4_ = fVar2;
          auVar49._12_4_ = fVar2;
          auVar49._16_4_ = fVar2;
          auVar49._20_4_ = fVar2;
          auVar49._24_4_ = fVar2;
          auVar49._28_4_ = fVar2;
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100),auVar49,
                                    *(undefined1 (*) [32])(uVar22 + 0x40));
          auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x140),auVar49,
                                    *(undefined1 (*) [32])(uVar22 + 0x80));
          auVar15 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x180),auVar49,
                                    *(undefined1 (*) [32])(uVar22 + 0xc0));
          auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x120),auVar49,
                                    *(undefined1 (*) [32])(uVar22 + 0x60));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x160),auVar49,
                                    *(undefined1 (*) [32])(uVar22 + 0xa0));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x1a0),auVar49,
                                    *(undefined1 (*) [32])(uVar22 + 0xe0));
          auVar43 = vmaxps_avx512vl(auVar34,ZEXT1632(auVar32));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar16));
          auVar44 = vsubps_avx512vl(auVar43,auVar34);
          auVar43 = vmaxps_avx512vl(auVar35,ZEXT1632(auVar14));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar17));
          auVar45 = vsubps_avx512vl(auVar43,auVar35);
          auVar43 = vmaxps_avx512vl(auVar36,ZEXT1632(auVar15));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar18));
          auVar43 = vsubps_avx512vl(auVar43,auVar36);
          auVar51._0_4_ =
               auVar43._0_4_ * auVar43._0_4_ +
               auVar44._0_4_ * auVar44._0_4_ + auVar45._0_4_ * auVar45._0_4_;
          auVar51._4_4_ =
               auVar43._4_4_ * auVar43._4_4_ +
               auVar44._4_4_ * auVar44._4_4_ + auVar45._4_4_ * auVar45._4_4_;
          auVar51._8_4_ =
               auVar43._8_4_ * auVar43._8_4_ +
               auVar44._8_4_ * auVar44._8_4_ + auVar45._8_4_ * auVar45._8_4_;
          auVar51._12_4_ =
               auVar43._12_4_ * auVar43._12_4_ +
               auVar44._12_4_ * auVar44._12_4_ + auVar45._12_4_ * auVar45._12_4_;
          auVar51._16_4_ =
               auVar43._16_4_ * auVar43._16_4_ +
               auVar44._16_4_ * auVar44._16_4_ + auVar45._16_4_ * auVar45._16_4_;
          auVar51._20_4_ =
               auVar43._20_4_ * auVar43._20_4_ +
               auVar44._20_4_ * auVar44._20_4_ + auVar45._20_4_ * auVar45._20_4_;
          auVar51._24_4_ =
               auVar43._24_4_ * auVar43._24_4_ +
               auVar44._24_4_ * auVar44._24_4_ + auVar45._24_4_ * auVar45._24_4_;
          auVar51._28_4_ = auVar43._28_4_ + auVar45._28_4_ + 0.0;
          uVar31 = vcmpps_avx512vl(auVar51,auVar33,2);
          uVar24 = vcmpps_avx512vl(ZEXT1632(auVar32),ZEXT1632(auVar16),2);
          uVar31 = uVar31 & uVar24;
          if ((uVar27 & 7) == 6) {
            uVar12 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [32])(uVar22 + 0x1c0),0xd);
            uVar11 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [32])(uVar22 + 0x1e0),1);
            uVar31 = (ulong)(byte)((byte)uVar12 & (byte)uVar11 & (byte)uVar31);
          }
        }
        else {
          if ((uVar28 & 8) != 0) goto LAB_01f2317e;
          uVar24 = uVar28 & 0xfffffffffffffff0;
          fVar2 = query->time;
          auVar46._4_4_ = fVar2;
          auVar46._0_4_ = fVar2;
          auVar46._8_4_ = fVar2;
          auVar46._12_4_ = fVar2;
          auVar46._16_4_ = fVar2;
          auVar46._20_4_ = fVar2;
          auVar46._24_4_ = fVar2;
          auVar46._28_4_ = fVar2;
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100),auVar46,
                                    *(undefined1 (*) [32])(uVar24 + 0x40));
          auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x140),auVar46,
                                    *(undefined1 (*) [32])(uVar24 + 0x80));
          auVar15 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x180),auVar46,
                                    *(undefined1 (*) [32])(uVar24 + 0xc0));
          auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x120),auVar46,
                                    *(undefined1 (*) [32])(uVar24 + 0x60));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x160),auVar46,
                                    *(undefined1 (*) [32])(uVar24 + 0xa0));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x1a0),auVar46,
                                    *(undefined1 (*) [32])(uVar24 + 0xe0));
          auVar43 = vmaxps_avx512vl(auVar34,ZEXT1632(auVar32));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar16));
          auVar44 = vsubps_avx512vl(auVar43,auVar34);
          auVar43 = vmaxps_avx512vl(auVar35,ZEXT1632(auVar14));
          auVar43 = vminps_avx(auVar43,ZEXT1632(auVar17));
          auVar43 = vsubps_avx512vl(auVar43,auVar35);
          auVar45 = vmaxps_avx512vl(auVar36,ZEXT1632(auVar15));
          auVar45 = vminps_avx512vl(auVar45,ZEXT1632(auVar18));
          auVar45 = vsubps_avx512vl(auVar45,auVar36);
          auVar45 = vmulps_avx512vl(auVar45,auVar45);
          auVar51._0_4_ =
               auVar45._0_4_ + auVar43._0_4_ * auVar43._0_4_ + auVar44._0_4_ * auVar44._0_4_;
          auVar51._4_4_ =
               auVar45._4_4_ + auVar43._4_4_ * auVar43._4_4_ + auVar44._4_4_ * auVar44._4_4_;
          auVar51._8_4_ =
               auVar45._8_4_ + auVar43._8_4_ * auVar43._8_4_ + auVar44._8_4_ * auVar44._8_4_;
          auVar51._12_4_ =
               auVar45._12_4_ + auVar43._12_4_ * auVar43._12_4_ + auVar44._12_4_ * auVar44._12_4_;
          auVar51._16_4_ =
               auVar45._16_4_ + auVar43._16_4_ * auVar43._16_4_ + auVar44._16_4_ * auVar44._16_4_;
          auVar51._20_4_ =
               auVar45._20_4_ + auVar43._20_4_ * auVar43._20_4_ + auVar44._20_4_ * auVar44._20_4_;
          auVar51._24_4_ =
               auVar45._24_4_ + auVar43._24_4_ * auVar43._24_4_ + auVar44._24_4_ * auVar44._24_4_;
          auVar51._28_4_ = auVar45._28_4_ + auVar43._28_4_ + auVar44._28_4_;
          uVar12 = vcmpps_avx512vl(ZEXT1632(auVar32),ZEXT1632(auVar16),2);
          uVar11 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar37,1);
          uVar6 = vcmpps_avx512vl(ZEXT1632(auVar32),auVar38,6);
          uVar7 = vcmpps_avx512vl(ZEXT1632(auVar17),auVar39,1);
          uVar8 = vcmpps_avx512vl(ZEXT1632(auVar14),auVar40,6);
          uVar9 = vcmpps_avx512vl(ZEXT1632(auVar18),auVar41,1);
          uVar10 = vcmpps_avx512vl(ZEXT1632(auVar15),auVar42,6);
          bVar23 = ~((byte)uVar8 | (byte)uVar6 | (byte)uVar10 | (byte)uVar11 |
                    (byte)uVar7 | (byte)uVar9) & (byte)uVar12;
          uVar31 = (ulong)bVar23;
          if ((uVar27 & 7) == 6) {
            uVar12 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(uVar24 + 0x1e0),1);
            uVar11 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(uVar24 + 0x1c0),0xd);
            uVar31 = (ulong)(bVar23 & (byte)uVar12 & (byte)uVar11);
          }
        }
        bVar23 = (byte)uVar31;
        if (bVar23 == 0) {
          if (puVar26 == &local_2378) {
            return bVar20;
          }
          goto LAB_01f22c22;
        }
        auVar43 = *(undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0);
        auVar44 = ((undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0))[1];
        auVar45 = vmovdqa64_avx512vl(auVar59._0_32_);
        auVar45 = vpternlogd_avx512vl(auVar45,auVar51,auVar60._0_32_,0xf8);
        auVar46 = vpcompressd_avx512vl(auVar45);
        auVar48._0_4_ =
             (uint)(bVar23 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar45._0_4_;
        bVar19 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar19 * auVar46._4_4_ | (uint)!bVar19 * auVar45._4_4_;
        bVar19 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar19 * auVar46._8_4_ | (uint)!bVar19 * auVar45._8_4_;
        bVar19 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar19 * auVar46._12_4_ | (uint)!bVar19 * auVar45._12_4_;
        bVar19 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar19 * auVar46._16_4_ | (uint)!bVar19 * auVar45._16_4_;
        bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar19 * auVar46._20_4_ | (uint)!bVar19 * auVar45._20_4_;
        bVar19 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar19 * auVar46._24_4_ | (uint)!bVar19 * auVar45._24_4_;
        bVar19 = SUB81(uVar31 >> 7,0);
        auVar48._28_4_ = (uint)bVar19 * auVar46._28_4_ | (uint)!bVar19 * auVar45._28_4_;
        auVar45 = vpermt2q_avx512vl(auVar43,auVar48,auVar44);
        uVar28 = auVar45._0_8_;
        bVar23 = bVar23 - 1 & bVar23;
      } while (bVar23 == 0);
      auVar45 = vpshufd_avx2(auVar48,0x55);
      vpermt2q_avx512vl(auVar43,auVar45,auVar44);
      auVar46 = vpminsd_avx2(auVar48,auVar45);
      auVar45 = vpmaxsd_avx2(auVar48,auVar45);
      bVar23 = bVar23 - 1 & bVar23;
      if (bVar23 == 0) {
        auVar46 = vpermi2q_avx512vl(auVar46,auVar43,auVar44);
        uVar28 = auVar46._0_8_;
        auVar43 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
        *puVar26 = auVar43._0_8_;
        auVar43 = vpermd_avx2(auVar45,auVar51);
        *(int *)(puVar26 + 1) = auVar43._0_4_;
        puVar26 = puVar26 + 2;
      }
      else {
        auVar50 = vpshufd_avx2(auVar48,0xaa);
        vpermt2q_avx512vl(auVar43,auVar50,auVar44);
        auVar49 = vpminsd_avx2(auVar46,auVar50);
        auVar46 = vpmaxsd_avx2(auVar46,auVar50);
        auVar50 = vpminsd_avx2(auVar45,auVar46);
        auVar45 = vpmaxsd_avx2(auVar45,auVar46);
        bVar23 = bVar23 - 1 & bVar23;
        if (bVar23 == 0) {
          auVar46 = vpermi2q_avx512vl(auVar49,auVar43,auVar44);
          uVar28 = auVar46._0_8_;
          auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
          *puVar26 = auVar46._0_8_;
          auVar45 = vpermd_avx2(auVar45,auVar51);
          *(int *)(puVar26 + 1) = auVar45._0_4_;
          auVar43 = vpermt2q_avx512vl(auVar43,auVar50,auVar44);
          puVar26[2] = auVar43._0_8_;
          auVar43 = vpermd_avx2(auVar50,auVar51);
          *(int *)(puVar26 + 3) = auVar43._0_4_;
          puVar26 = puVar26 + 4;
        }
        else {
          auVar46 = vpshufd_avx2(auVar48,0xff);
          vpermt2q_avx512vl(auVar43,auVar46,auVar44);
          auVar5 = vpminsd_avx2(auVar49,auVar46);
          auVar46 = vpmaxsd_avx2(auVar49,auVar46);
          auVar49 = vpminsd_avx2(auVar50,auVar46);
          auVar46 = vpmaxsd_avx2(auVar50,auVar46);
          auVar50 = vpminsd_avx2(auVar45,auVar46);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar46 = vpermi2q_avx512vl(auVar5,auVar43,auVar44);
            uVar28 = auVar46._0_8_;
            auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
            *puVar26 = auVar46._0_8_;
            auVar45 = vpermd_avx2(auVar45,auVar51);
            *(int *)(puVar26 + 1) = auVar45._0_4_;
            auVar45 = vpermt2q_avx512vl(auVar43,auVar50,auVar44);
            puVar26[2] = auVar45._0_8_;
            auVar45 = vpermd_avx2(auVar50,auVar51);
            *(int *)(puVar26 + 3) = auVar45._0_4_;
            auVar43 = vpermt2q_avx512vl(auVar43,auVar49,auVar44);
            puVar26[4] = auVar43._0_8_;
            auVar43 = vpermd_avx2(auVar49,auVar51);
            *(int *)(puVar26 + 5) = auVar43._0_4_;
            puVar26 = puVar26 + 6;
          }
          else {
            auVar47 = valignd_avx512vl(auVar48,auVar48,3);
            auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar48 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar46,auVar5);
            auVar46 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar49 = vpermt2d_avx512vl(auVar48,auVar46,auVar49);
            auVar49 = vpermt2d_avx512vl(auVar49,auVar46,auVar50);
            auVar46 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar45 = vpermt2d_avx512vl(auVar49,auVar46,auVar45);
            auVar52 = ZEXT3264(auVar45);
            bVar25 = bVar23;
            do {
              auVar46 = auVar52._0_32_;
              auVar45._8_4_ = 1;
              auVar45._0_8_ = 0x100000001;
              auVar45._12_4_ = 1;
              auVar45._16_4_ = 1;
              auVar45._20_4_ = 1;
              auVar45._24_4_ = 1;
              auVar45._28_4_ = 1;
              auVar45 = vpermd_avx2(auVar45,auVar47);
              auVar47 = valignd_avx512vl(auVar47,auVar47,1);
              vpermt2q_avx512vl(auVar43,auVar47,auVar44);
              bVar25 = bVar25 - 1 & bVar25;
              uVar12 = vpcmpd_avx512vl(auVar45,auVar46,5);
              auVar45 = vpmaxsd_avx2(auVar45,auVar46);
              bVar13 = (byte)uVar12 << 1;
              auVar46 = valignd_avx512vl(auVar46,auVar46,7);
              bVar19 = (bool)((byte)uVar12 & 1);
              auVar50._4_4_ = (uint)bVar19 * auVar46._4_4_ | (uint)!bVar19 * auVar45._4_4_;
              auVar50._0_4_ = auVar45._0_4_;
              bVar19 = (bool)(bVar13 >> 2 & 1);
              auVar50._8_4_ = (uint)bVar19 * auVar46._8_4_ | (uint)!bVar19 * auVar45._8_4_;
              bVar19 = (bool)(bVar13 >> 3 & 1);
              auVar50._12_4_ = (uint)bVar19 * auVar46._12_4_ | (uint)!bVar19 * auVar45._12_4_;
              bVar19 = (bool)(bVar13 >> 4 & 1);
              auVar50._16_4_ = (uint)bVar19 * auVar46._16_4_ | (uint)!bVar19 * auVar45._16_4_;
              bVar19 = (bool)(bVar13 >> 5 & 1);
              auVar50._20_4_ = (uint)bVar19 * auVar46._20_4_ | (uint)!bVar19 * auVar45._20_4_;
              bVar19 = (bool)(bVar13 >> 6 & 1);
              auVar50._24_4_ = (uint)bVar19 * auVar46._24_4_ | (uint)!bVar19 * auVar45._24_4_;
              auVar50._28_4_ =
                   (uint)(bVar13 >> 7) * auVar46._28_4_ |
                   (uint)!(bool)(bVar13 >> 7) * auVar45._28_4_;
              auVar52 = ZEXT3264(auVar50);
            } while (bVar25 != 0);
            lVar21 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
            do {
              auVar45 = vpermi2q_avx512vl(auVar50,auVar43,auVar44);
              *puVar26 = auVar45._0_8_;
              auVar46 = auVar52._0_32_;
              auVar45 = vpermd_avx2(auVar46,auVar51);
              *(int *)(puVar26 + 1) = auVar45._0_4_;
              auVar50 = valignd_avx512vl(auVar46,auVar46,1);
              puVar26 = puVar26 + 2;
              auVar52 = ZEXT3264(auVar50);
              lVar21 = lVar21 + -1;
            } while (lVar21 != 0);
            auVar43 = vpermt2q_avx512vl(auVar43,auVar50,auVar44);
            uVar28 = auVar43._0_8_;
          }
        }
      }
    } while( true );
  }
  goto LAB_01f2330f;
LAB_01f231c6:
  do {
    bVar25 = 0;
    lVar30 = 0;
    do {
      if (*(int *)(lVar29 + lVar30 * 4) == -1) break;
      uVar4 = *(uint *)(lVar29 + -0x10 + lVar30 * 4);
      this = (context->scene->geometries).items[uVar4].ptr;
      context->geomID = uVar4;
      context->primID = *(uint *)(lVar29 + lVar30 * 4);
      bVar19 = Geometry::pointQuery(this,query,context);
      bVar25 = bVar25 | bVar19;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 4);
    bVar23 = bVar23 | bVar25;
    lVar21 = lVar21 + 1;
    lVar29 = lVar29 + 0x50;
  } while (lVar21 != (ulong)(uVar27 & 0xf) - 8);
  if (bVar23 == 0) {
    auVar54 = ZEXT3264(auVar53);
    auVar56 = ZEXT3264(auVar55);
    auVar58 = ZEXT3264(auVar57);
    auVar33 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar59 = ZEXT3264(auVar33);
    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar60 = ZEXT3264(auVar33);
  }
  else {
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar54 = ZEXT3264(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar56 = ZEXT3264(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar58 = ZEXT3264(auVar33);
    auVar33 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar59 = ZEXT3264(auVar33);
    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar60 = ZEXT3264(auVar33);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2458 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      local_2458 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    bVar20 = true;
  }
LAB_01f2330f:
  auVar33 = vmulps_avx512vl(auVar54._0_32_,auVar54._0_32_);
  if (puVar26 == &local_2378) {
    return bVar20;
  }
  goto LAB_01f22bfe;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }